

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O1

void __thiscall
booster::aio::basic_socket::set_option
          (basic_socket *this,boolean_option_type opt,bool v,error_code *e)

{
  error_category *peVar1;
  native_type __fd;
  int iVar2;
  int *piVar3;
  undefined7 in_register_00000011;
  int __level;
  int value;
  undefined4 local_c;
  
  local_c = (undefined4)CONCAT71(in_register_00000011,v);
  if (opt == reuse_address) {
    __fd = basic_io_device::native(&this->super_basic_io_device);
    __level = 1;
    iVar2 = 2;
  }
  else if (opt == keep_alive) {
    __fd = basic_io_device::native(&this->super_basic_io_device);
    __level = 1;
    iVar2 = 9;
  }
  else {
    iVar2 = 0;
    if (opt != tcp_no_delay) goto LAB_00165461;
    __fd = basic_io_device::native(&this->super_basic_io_device);
    __level = 6;
    iVar2 = 1;
  }
  iVar2 = setsockopt(__fd,__level,iVar2,&local_c,4);
LAB_00165461:
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    peVar1 = syscat;
    e->_M_value = *piVar3;
    e->_M_cat = peVar1;
  }
  return;
}

Assistant:

void basic_socket::set_option(boolean_option_type opt,bool v,system::error_code &e)
{
	int value = v ? 1 : 0;
	char const *p=reinterpret_cast<char const *>(&value);
	int res = 0;
	switch(opt) {
	case tcp_no_delay:
		res=::setsockopt(native(),IPPROTO_TCP,TCP_NODELAY,p,sizeof(value));
		break;
	case keep_alive:
		res=::setsockopt(native(),SOL_SOCKET,SO_KEEPALIVE,p,sizeof(value));
		break;
	case reuse_address:
		res=::setsockopt(native(),SOL_SOCKET,SO_REUSEADDR,p,sizeof(value));
		break;
	default:
		;
	}
	if(res < 0)
		e=geterror();
}